

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context_id.cpp
# Opt level: O1

bool anon_unknown.dwarf_1256c0::open_map
               (char *filename,
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
               *cmap,Iconv *iconv)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  long lVar2;
  char *pcVar3;
  char *pcVar4;
  char cVar5;
  undefined1 uVar6;
  int iVar7;
  ostream *poVar8;
  size_t sVar9;
  istream *piVar10;
  char *pcVar11;
  ulong uVar12;
  char **ppcVar13;
  char *pcVar14;
  long lVar15;
  char *pcVar16;
  bool bVar17;
  string line;
  string pos;
  char *col [2];
  ifstream ifs;
  char *local_2b0;
  long local_2a8;
  char local_2a0 [16];
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
  local_290;
  string local_268;
  char *local_248 [2];
  long local_238 [4];
  byte abStack_218 [488];
  
  std::ifstream::ifstream(local_238,filename,_S_in);
  if ((abStack_218[*(long *)(local_238[0] + -0x18)] & 5) != 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/context_id.cpp"
               ,0x70);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"(",1);
    poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x13);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,") [",3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"ifs",3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"] ",2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"no such file or directory: ",0x1b);
    if (filename == (char *)0x0) {
      std::ios::clear((int)poVar8 + (int)*(undefined8 *)(*(long *)poVar8 + -0x18));
    }
    else {
      sVar9 = strlen(filename);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,filename,sVar9);
    }
    MeCab::die::~die((die *)&local_290);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ::clear(&cmap->_M_t);
  local_2b0 = local_2a0;
  local_2a8 = 0;
  local_2a0[0] = '\0';
  paVar1 = &local_290.first.field_2;
  do {
    cVar5 = std::ios::widen((char)*(undefined8 *)(local_238[0] + -0x18) + (char)(istream *)local_238
                           );
    piVar10 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                        ((istream *)local_238,(string *)&local_2b0,cVar5);
    pcVar16 = local_2b0;
    if (((byte)piVar10[*(long *)(*(long *)piVar10 + -0x18) + 0x20] & 5) != 0) {
      if (local_2b0 != local_2a0) {
        operator_delete(local_2b0);
      }
      uVar6 = std::ifstream::~ifstream(local_238);
      return (bool)uVar6;
    }
    sVar9 = strlen(local_2b0);
    pcVar11 = pcVar16 + sVar9;
    ppcVar13 = local_248;
    uVar12 = 0;
    do {
      pcVar3 = pcVar11;
      pcVar4 = pcVar16;
      if (1 < uVar12) break;
      for (; pcVar14 = pcVar11, pcVar4 != pcVar11; pcVar4 = pcVar4 + 1) {
        if (*pcVar4 != ' ') {
          lVar15 = 0;
          do {
            bVar17 = lVar15 == 1;
            pcVar14 = pcVar3;
            if (bVar17) goto LAB_0012e391;
            lVar2 = lVar15 + 1;
            lVar15 = lVar15 + 1;
          } while (*pcVar4 != " \t"[lVar2]);
        }
        bVar17 = false;
        pcVar14 = pcVar4;
LAB_0012e391:
        if (!bVar17) break;
        pcVar3 = pcVar14;
      }
      *pcVar14 = '\0';
      if (*pcVar16 != '\0') {
        *ppcVar13 = pcVar16;
        ppcVar13 = ppcVar13 + 1;
        uVar12 = uVar12 + 1;
      }
      pcVar16 = pcVar14 + 1;
    } while (pcVar14 != pcVar11);
    if (uVar12 != 2) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,
                 "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/context_id.cpp"
                 ,0x70);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"(",1);
      poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x19);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,") [",3);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar8,"2 == tokenize2(const_cast<char *>(line.c_str()), \" \\t\", col, 2)",0x3f);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"] ",2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"format error: ",0xe);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,local_2b0,local_2a8);
      MeCab::die::~die((die *)&local_290);
    }
    std::__cxx11::string::string((string *)&local_268,local_248[1],(allocator *)&local_290);
    if (iconv != (Iconv *)0x0) {
      MeCab::Iconv::convert(iconv,&local_268);
    }
    iVar7 = atoi(local_248[0]);
    local_290.first._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_290,local_268._M_dataplus._M_p,
               local_268._M_dataplus._M_p + local_268._M_string_length);
    local_290.second = iVar7;
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,int>,std::_Select1st<std::pair<std::__cxx11::string_const,int>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>
    ::_M_emplace_unique<std::pair<std::__cxx11::string,int>>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,int>,std::_Select1st<std::pair<std::__cxx11::string_const,int>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>
                *)cmap,&local_290);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_290.first._M_dataplus._M_p != paVar1) {
      operator_delete(local_290.first._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_268._M_dataplus._M_p != &local_268.field_2) {
      operator_delete(local_268._M_dataplus._M_p);
    }
  } while( true );
}

Assistant:

bool open_map(const char *filename,
              std::map<std::string, int> *cmap,
              Iconv *iconv) {
  std::ifstream ifs(WPATH(filename));
  CHECK_DIE(ifs) << "no such file or directory: " << filename;
  cmap->clear();
  char *col[2];
  std::string line;
  while (std::getline(ifs, line)) {
    CHECK_DIE(2 == tokenize2(const_cast<char *>(line.c_str()),
                             " \t", col, 2))
        << "format error: " << line;
    std::string pos = col[1];
    if (iconv) {
      iconv->convert(&pos);
    }
    cmap->insert(std::pair<std::string, int>
                 (pos, std::atoi(col[0])));
  }
  return true;
}